

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_cmp(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  int iVar1;
  TCGContext_conflict2 *pTVar2;
  TCGv_i32 arg;
  bool bVar3;
  bool bVar4;
  TCGv_i32 src;
  TCGTemp *pTVar5;
  TCGv_i32 ret;
  uint opsize;
  
  pTVar2 = s->uc->tcg_ctx;
  opsize = insn >> 6 & 3;
  switch(opsize) {
  default:
    bVar3 = false;
    bVar4 = true;
    opsize = 0;
    goto LAB_006fb54c;
  case 1:
    bVar3 = false;
    break;
  case 2:
    bVar3 = true;
  }
  bVar4 = false;
LAB_006fb54c:
  src = gen_ea_mode(env,s,insn >> 3 & 7,insn & 7,opsize,pTVar2->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADS,
                    (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (src == pTVar2->NULL_QREG) {
    gen_exception(s,(s->base).pc_next,3);
    return;
  }
  arg = *(TCGv_i32 *)((long)pTVar2->cpu_dregs + (ulong)(insn >> 6 & 0x38));
  ret = arg;
  if (!bVar3) {
    pTVar2 = s->uc->tcg_ctx;
    pTVar5 = tcg_temp_new_internal_m68k(pTVar2,TCG_TYPE_I32,false);
    iVar1 = s->release_count;
    if (7 < (long)iVar1) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/m68k/translate.c"
                 ,0x91,"s->release_count < MAX_TO_RELEASE");
    }
    ret = (TCGv_i32)((long)pTVar5 - (long)pTVar2);
    s->release_count = iVar1 + 1;
    s->release[iVar1] = ret;
    if (bVar4) {
      tcg_gen_ext8s_i32_m68k(pTVar2,ret,arg);
    }
    else {
      tcg_gen_ext16s_i32_m68k(pTVar2,ret,arg);
    }
  }
  gen_update_cc_cmp(s,ret,src,opsize);
  return;
}

Assistant:

DISAS_INSN(cmp)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src;
    TCGv reg;
    int opsize;

    opsize = insn_opsize(insn);
    SRC_EA(env, src, opsize, 1, NULL);
    reg = gen_extend(s, DREG(insn, 9), opsize, 1);
    gen_update_cc_cmp(s, reg, src, opsize);
}